

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void __thiscall
sensors_analytics::utils::ObjectNode::SetNumber
          (ObjectNode *this,string *property_name,int32_t value)

{
  mapped_type *this_00;
  ValueNode local_a8;
  int32_t local_1c;
  string *psStack_18;
  int32_t value_local;
  string *property_name_local;
  ObjectNode *this_local;
  
  local_1c = value;
  psStack_18 = property_name;
  property_name_local = (string *)this;
  ValueNode::ValueNode(&local_a8,(long)value);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>_>
            ::operator[](&this->properties_map_,psStack_18);
  ValueNode::operator=(this_00,&local_a8);
  ValueNode::~ValueNode(&local_a8);
  return;
}

Assistant:

void ObjectNode::SetNumber(const string &property_name, int32_t value) {
  properties_map_[property_name] = ValueNode(static_cast<int64_t>(value));
}